

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

int ImPlot::LabelAxisValue
              (ImPlotAxis *axis,ImPlotTickCollection *ticks,double value,char *buff,int size)

{
  ImPlotTimeUnit idx;
  uint uVar1;
  int iVar2;
  ImPlotTick *pIVar3;
  undefined4 in_R9D;
  bool bVar4;
  double dVar5;
  ImPlotTime IVar6;
  ImPlotDateTimeFmt IVar7;
  ImPlotDateTimeFmt fmt;
  time_t local_30;
  int local_28;
  
  if ((axis->Flags & 0x40) == 0) {
    if (ticks->Size < 2) {
      dVar5 = (axis->Range).Max;
      pIVar3 = (ImPlotTick *)&axis->Range;
    }
    else {
      pIVar3 = ImVector<ImPlotTick>::operator[](&ticks->Ticks,1);
      dVar5 = pIVar3->PlotPos;
      pIVar3 = ImVector<ImPlotTick>::operator[](&ticks->Ticks,0);
    }
    uVar1 = Precision(dVar5 - pIVar3->PlotPos);
    iVar2 = snprintf(buff,(long)size,"%.*f",value,(ulong)uVar1);
    return iVar2;
  }
  bVar4 = axis->Orientation != 0;
  idx = GetUnitForRange(((axis->Range).Max - (axis->Range).Min) /
                        (double)(((&(GImPlot->CurrentPlot->PlotRect).Max.x)[bVar4] -
                                 (&(GImPlot->CurrentPlot->PlotRect).Min.x)[bVar4]) / 100.0));
  IVar6 = ImPlotTime::FromDouble(value);
  local_30 = IVar6.S;
  local_28 = IVar6.Us;
  IVar7 = GetDateTimeFmt((ImPlotDateTimeFmt *)TimeFormatMouseCursor,idx);
  fmt.Date = IVar7._8_4_ & 0xffff;
  fmt.Time = 0;
  fmt.UseISO8601 = (bool)(char)in_R9D;
  fmt.Use24HourClock = (bool)(char)((uint)in_R9D >> 8);
  fmt._10_2_ = (short)((uint)in_R9D >> 0x10);
  iVar2 = FormatDateTime((ImPlot *)&local_30,(ImPlotTime *)buff,(char *)(ulong)(uint)size,IVar7.Date
                         ,fmt);
  return iVar2;
}

Assistant:

int LabelAxisValue(const ImPlotAxis& axis, const ImPlotTickCollection& ticks, double value, char* buff, int size) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(axis.Flags, ImPlotAxisFlags_Time)) {
        ImPlotTimeUnit unit = (axis.Orientation == ImPlotOrientation_Horizontal)
                            ? GetUnitForRange(axis.Range.Size() / (gp.CurrentPlot->PlotRect.GetWidth() / 100))
                            : GetUnitForRange(axis.Range.Size() / (gp.CurrentPlot->PlotRect.GetHeight() / 100));
        return FormatDateTime(ImPlotTime::FromDouble(value), buff, size, GetDateTimeFmt(TimeFormatMouseCursor, unit));
    }
    else {
        double range = ticks.Size > 1 ? (ticks.Ticks[1].PlotPos - ticks.Ticks[0].PlotPos) : axis.Range.Size();
        return snprintf(buff, size, "%.*f", Precision(range), value);
    }
}